

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportMemory
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index memory_index,Limits *page_limits)

{
  Module *this_00;
  bool bVar1;
  pointer pMVar2;
  Location local_70;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_50;
  undefined1 local_48 [8];
  __single_object import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderIR *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  import._M_t.super___uniq_ptr_impl<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>.
  super__Head_base<0UL,_wabt::MemoryImport_*,_false>._M_head_impl._4_4_ = import_index;
  std::make_unique<wabt::MemoryImport>();
  pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::operator->
                     ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pMVar2->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.module_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::operator->
                     ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pMVar2->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.field_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pMVar2 = std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::operator->
                     ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                      local_48);
  (pMVar2->memory).page_limits.initial = page_limits->initial;
  (pMVar2->memory).page_limits.max = page_limits->max;
  bVar1 = page_limits->is_shared;
  (pMVar2->memory).page_limits.has_max = page_limits->has_max;
  (pMVar2->memory).page_limits.is_shared = bVar1;
  (pMVar2->memory).page_limits.is_64 = page_limits->is_64;
  this_00 = this->module_;
  GetLocation(&local_70,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
            ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)&local_50,
             (Location *)local_48);
  Module::AppendField(this_00,&local_50);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_50);
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  std::unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_>::~unique_ptr
            ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)local_48);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportMemory(Index import_index,
                                      std::string_view module_name,
                                      std::string_view field_name,
                                      Index memory_index,
                                      const Limits* page_limits) {
  auto import = std::make_unique<MemoryImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->memory.page_limits = *page_limits;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}